

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

void __thiscall test_get_rows_back::initialize_tensors(test_get_rows_back *this,ggml_context *ctx)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  allocator_type *__a;
  reference pvVar5;
  int *piVar6;
  undefined8 in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int i;
  vector<int,_std::allocator<int>_> data;
  ggml_tensor *t;
  float in_stack_00000208;
  float in_stack_0000020c;
  ggml_tensor *in_stack_00000210;
  undefined1 *__n;
  int local_48;
  undefined1 local_31;
  vector<int,_std::allocator<int>_> local_30;
  int *local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  for (local_18 = (int *)ggml_get_first_tensor(in_RSI); local_18 != (int *)0x0;
      local_18 = (int *)ggml_get_next_tensor(local_10,local_18)) {
    if (*local_18 == 0x1a) {
      bVar3 = ggml_is_view_op(local_18[0x14]);
      if (!bVar3) {
        __a = (allocator_type *)
              (long)(*(int *)((long)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage + 4) *
                    *(int *)&in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
        __n = &local_31;
        std::allocator<int>::allocator((allocator<int> *)0x145f7d);
        std::vector<int,_std::allocator<int>_>::vector(in_RDI,(size_type)__n,__a);
        std::allocator<int>::~allocator((allocator<int> *)0x145f9d);
        for (local_48 = 0; piVar2 = local_18,
            local_48 <
            *(int *)((long)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4) *
            *(int *)&in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; local_48 = local_48 + 1) {
          iVar4 = rand();
          iVar1 = *(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_48);
          *pvVar5 = iVar4 % iVar1;
        }
        piVar6 = std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)0x14601e);
        ggml_backend_tensor_set
                  (piVar2,piVar6,0,
                   (long)(*(int *)((long)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 4) *
                         *(int *)&in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) << 2);
        std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
      }
    }
    else {
      init_tensor_uniform(in_stack_00000210,in_stack_0000020c,in_stack_00000208);
    }
  }
  return;
}

Assistant:

void initialize_tensors(ggml_context * ctx) override {
        for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
            if (t->type == GGML_TYPE_I32) {
                if (ggml_is_view_op(t->op)) { continue; }
                // rows
                std::vector<int> data(r*b);
                for (int i = 0; i < r*b; i++) {
                    data[i] = rand() % m;
                }
                ggml_backend_tensor_set(t, data.data(), 0, r * b * sizeof(int));
            } else {
                init_tensor_uniform(t);
            }
        }
    }